

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

void __thiscall rw::Frame::updateObjects(Frame *this)

{
  Frame *this_local;
  
  if (((this->root->object).privateFlags & 3) == 0) {
    LinkList::add((LinkList *)(engine + 0x10),&this->root->inDirtyList);
  }
  (this->root->object).privateFlags = (this->root->object).privateFlags | 3;
  (this->object).privateFlags = (this->object).privateFlags | 0xc;
  return;
}

Assistant:

void
Frame::updateObjects(void)
{
	// Mark root as dirty and insert into dirty list if necessary
	if((this->root->object.privateFlags & HIERARCHYSYNC) == 0)
		engine->frameDirtyList.add(&this->root->inDirtyList);
	this->root->object.privateFlags |= HIERARCHYSYNC;
	// Mark subtree as dirty as well
	this->object.privateFlags |= SUBTREESYNC;
}